

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void hash_table_create(hash_table_t *table,uint initial_size,_func_int_void_ptr_void_ptr *is_equal,
                      _func_size_t_void_ptr *hash)

{
  void *pvVar1;
  void *__ptr;
  undefined1 auVar2 [16];
  int iVar3;
  hash_table_bucket_t *phVar4;
  hash_table_bucket_t *phVar5;
  uint x;
  ulong uVar6;
  undefined8 *__nmemb;
  long lVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar12;
  
  uVar8 = 2;
  if (2 < initial_size) {
    uVar8 = initial_size;
  }
  table->n_items = 0;
  uVar8 = uVar8 - 1;
  iVar3 = uint32_log2(uVar8);
  x = 2 << ((byte)iVar3 & 0x1f);
  table->n_buckets = x;
  __nmemb = (undefined8 *)(ulong)(uint)(4 << ((byte)iVar3 & 0x1f));
  phVar4 = (hash_table_bucket_t *)calloc((size_t)__nmemb,0x10);
  table->allocs = phVar4;
  if (phVar4 == (hash_table_bucket_t *)0x0) {
    hash_table_create_cold_1();
    __ptr = (void *)__nmemb[3];
    while (__ptr != (void *)0x0) {
      pvVar1 = *(void **)((long)__ptr + 8);
      free(__ptr);
      __nmemb[3] = pvVar1;
      __ptr = pvVar1;
    }
    __nmemb[4] = 0;
    __nmemb[5] = 0;
    __nmemb[2] = 0;
    __nmemb[3] = 0;
    *__nmemb = 0;
    __nmemb[1] = 0;
    return;
  }
  table->buckets = phVar4 + 1;
  phVar5 = phVar4 + (ulong)x + 1;
  table->free_buckets = phVar5;
  auVar2 = _DAT_00113560;
  lVar7 = (ulong)uVar8 - 1;
  auVar9._8_4_ = (int)lVar7;
  auVar9._0_8_ = lVar7;
  auVar9._12_4_ = (int)((ulong)lVar7 >> 0x20);
  uVar6 = 2;
  if (2 < (ulong)initial_size) {
    uVar6 = (ulong)initial_size;
  }
  lVar7 = 0;
  auVar9 = auVar9 ^ _DAT_00113560;
  auVar10 = _DAT_00112070;
  do {
    auVar11 = auVar10 ^ auVar2;
    lVar12 = auVar10._8_8_;
    if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                auVar9._4_4_ < auVar11._4_4_) & 1)) {
      *(hash_table_bucket_t **)((long)&phVar4[(ulong)x + 1].next + lVar7) =
           phVar5 + auVar10._0_8_ + 1;
    }
    if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
        auVar11._12_4_ <= auVar9._12_4_) {
      *(hash_table_bucket_t **)((long)&phVar4[(ulong)x + 2].next + lVar7) = phVar5 + lVar12 + 1;
    }
    auVar10._0_8_ = auVar10._0_8_ + 2;
    auVar10._8_8_ = lVar12 + 2;
    lVar7 = lVar7 + 0x20;
  } while ((uVar6 & 0xffffffffffffffe) * 0x10 != lVar7);
  phVar4[(ulong)x + (ulong)uVar8 + 1].next = (hash_table_bucket_t *)0x0;
  table->is_equal = is_equal;
  table->hash = hash;
  table->seed = 0x1a08ee1184ba6d32;
  iVar3 = uint32_log2(x);
  (table->ghash).mult = 0x14057b7ef7678100;
  (table->ghash).add = 0x1a08ee1184ba6d00;
  (table->ghash).log2_buckets = iVar3;
  table->max_load = 1.0;
  table->max_collisions = 5;
  return;
}

Assistant:

void hash_table_create( hash_table_t * table, unsigned initial_size,
       int (*is_equal)(const void * a, const void * b),
       size_t (*hash)(const void * x) ) 
{
    unsigned i;
    if (initial_size < 2 ) initial_size = 2;

    table->n_items = 0;
    table->n_buckets = 1u << (int_log2( initial_size-1) + 1 );
    table->allocs  
        = calloc( 2*table->n_buckets, sizeof(hash_table_bucket_t));
    if ( table->allocs == NULL) {
        fprintf( stderr, "hash_table_create: Insufficient memory\n");
        abort();
    }

    table->buckets = table->allocs + 1;
    table->free_buckets  = table->allocs + table->n_buckets + 1;
    
    /* initialize free list */
    for ( i = 0; i < initial_size - 1; ++i )
        table->free_buckets[i].next = &table->free_buckets[i+1];
    table->free_buckets[initial_size-1].next = NULL;

    table->is_equal = is_equal;
    table->hash = hash;
    table->seed = 0;
    table->ghash 
        = new_universal_hash_function( &table->seed, table->n_buckets );

    /* some configurable constants */
    table->max_load = 1.0;
    table->max_collisions = 5;
}